

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::banner_get_info(uint argc)

{
  int iVar1;
  vm_obj_id_t obj;
  void *pvVar2;
  CVmConsoleBanner *pCVar3;
  CVmObject *lst_00;
  vm_val_t val;
  CVmObjList *lst;
  vm_obj_id_t lst_obj;
  CVmConsoleBanner *console;
  os_banner_info_t info;
  void *hdl;
  int id;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vm_datatype_t in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffa8;
  CVmConsoleBanner *in_stack_ffffffffffffffb0;
  
  CVmBif::check_argc(0,0x2b02e6);
  CVmBif::pop_int_val();
  CVmConsoleMain::get_banner_manager(G_console_X);
  pvVar2 = CVmBannerManager::get_os_handle(in_stack_ffffffffffffffa8.ptr,in_stack_ffffffffffffffa4);
  CVmConsoleMain::get_banner_manager(G_console_X);
  pCVar3 = CVmBannerManager::get_console
                     ((CVmBannerManager *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  if ((pvVar2 != (void *)0x0) && (pCVar3 != (CVmConsoleBanner *)0x0)) {
    iVar1 = CVmConsoleBanner::get_banner_info
                      (in_stack_ffffffffffffffb0,
                       (os_banner_info_t *)in_stack_ffffffffffffffa8.native_desc);
    if (iVar1 == 0) {
      CVmBif::retval_nil();
    }
    else {
      obj = CVmObjList::create(in_stack_ffffffffffffffa4,
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      lst_00 = vm_objp(0);
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffa0,obj);
      CVmStack::push((vm_val_t *)&stack0xffffffffffffffa0);
      set_list_int((CVmObjList *)lst_00,(size_t)in_stack_ffffffffffffffa8,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      set_list_int((CVmObjList *)lst_00,(size_t)in_stack_ffffffffffffffa8,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      set_list_int((CVmObjList *)lst_00,(size_t)in_stack_ffffffffffffffa8,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      set_list_int((CVmObjList *)lst_00,(size_t)in_stack_ffffffffffffffa8,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      set_list_int((CVmObjList *)lst_00,(size_t)in_stack_ffffffffffffffa8,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      set_list_int((CVmObjList *)lst_00,(size_t)in_stack_ffffffffffffffa8,
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      CVmBif::retval_obj(0);
      CVmStack::discard();
    }
    return;
  }
  err_throw(0);
}

Assistant:

void CVmBifTIO::banner_get_info(VMG_ uint argc)
{
    int id;
    void *hdl;
    os_banner_info_t info;
    CVmConsoleBanner *console;

    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the banner ID */
    id = pop_int_val(vmg0_);

    /* get the banner - if it's invalid, throw an error */
    hdl = G_console->get_banner_manager()->get_os_handle(id);
    console = G_console->get_banner_manager()->get_console(id);
    if (hdl == 0 || console == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* get information on the banner */
    if (console->get_banner_info(&info))
    {
        vm_obj_id_t lst_obj;
        CVmObjList *lst;
        vm_val_t val;
        
        /* set up a return list with space for six entries */
        lst_obj = CVmObjList::create(vmg_ FALSE, 6);
        lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* save the list on the stack to protect against garbage collection */
        val.set_obj(lst_obj);
        G_stk->push(&val);

        /* 
         *   return the values: [align, style, rows, columns, pix_height,
         *   pix_width] 
         */
        set_list_int(lst, 0, info.align);
        set_list_int(lst, 1, info.style);
        set_list_int(lst, 2, info.rows);
        set_list_int(lst, 3, info.columns);
        set_list_int(lst, 4, info.pix_height);
        set_list_int(lst, 5, info.pix_width);

        /* return the list */
        retval_obj(vmg_ lst_obj);

        /* discard our gc protection */
        G_stk->discard();
    }
    else
    {
        /* no information available - return nil */
        retval_nil(vmg0_);
    }